

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_key_share_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_90 [8];
  CBB kse_bytes;
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((hs->max_version < 0x304) ||
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->pake_prover), bVar1)) {
    return true;
  }
  bVar1 = Array<unsigned_char>::empty(&hs->key_share_bytes);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!hs->key_share_bytes.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x8e6,
                  "bool bssl::ext_key_share_add_clienthello(const SSL_HANDSHAKE *, CBB *, CBB *, ssl_client_hello_type_t)"
                 );
  }
  iVar2 = CBB_add_u16(out_compressible,0x33);
  if (((iVar2 != 0) &&
      (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&kse_bytes.u + 0x18)),
      iVar2 != 0)) &&
     (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&kse_bytes.u + 0x18),(CBB *)local_90),
     iVar2 != 0)) {
    data = Array<unsigned_char>::data(&hs->key_share_bytes);
    len = Array<unsigned_char>::size(&hs->key_share_bytes);
    iVar2 = CBB_add_bytes((CBB *)local_90,data,len);
    if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool ext_key_share_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                          CBB *out_compressible,
                                          ssl_client_hello_type_t type) {
  // If offering a PAKE, do not set up key shares. We do not currently support
  // clients offering both PAKE and non-PAKE modes, including resumption.
  if (hs->max_version < TLS1_3_VERSION || hs->pake_prover) {
    return true;
  }

  assert(!hs->key_share_bytes.empty());
  CBB contents, kse_bytes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_key_share) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &kse_bytes) ||
      !CBB_add_bytes(&kse_bytes, hs->key_share_bytes.data(),
                     hs->key_share_bytes.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}